

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_31::WebSocketPipeImpl::BlockedReceive::close(BlockedReceive *this,int __fd)

{
  _func_int **pp_Var1;
  bool bVar2;
  uint16_t in_DX;
  StringPtr *params;
  undefined4 in_register_00000034;
  WebSocket *obj;
  Close local_90;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> local_70;
  Fault local_38;
  Fault f;
  uint16_t code_local;
  BlockedReceive *this_local;
  StringPtr reason_local;
  
  obj = (WebSocket *)CONCAT44(in_register_00000034,__fd);
  f.exception._6_2_ = in_DX;
  reason_local.content.size_ = (size_t)this;
  bVar2 = Canceler::isEmpty((Canceler *)(obj + 3));
  if (!bVar2) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
              (&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0xb48,FAILED,"canceler.isEmpty()","\"already pumping\"",
               (char (*) [16])"already pumping");
    _::Debug::Fault::fatal(&local_38);
  }
  pp_Var1 = obj[1]._vptr_WebSocket;
  local_90.code = f.exception._6_2_;
  str<kj::StringPtr&>(&local_90.reason,(kj *)&this_local,params);
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::OneOf<kj::WebSocket::Close>
            (&local_70,&local_90);
  (**(code **)*pp_Var1)(pp_Var1,&local_70);
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::~OneOf(&local_70);
  WebSocket::Close::~Close(&local_90);
  endState((WebSocketPipeImpl *)obj[2]._vptr_WebSocket,obj);
  Promise<void>::Promise((Promise<void> *)this);
  return (int)this;
}

Assistant:

kj::Promise<void> close(uint16_t code, kj::StringPtr reason) override {
      KJ_REQUIRE(canceler.isEmpty(), "already pumping");
      fulfiller.fulfill(Message(Close { code, kj::str(reason) }));
      pipe.endState(*this);
      return kj::READY_NOW;
    }